

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint uVar1;
  int iVar2;
  uint local_5c;
  int word;
  int now;
  int carry;
  int sign;
  int bit;
  int last_set_bit;
  secp256k1_scalar s;
  int w_local;
  secp256k1_scalar *a_local;
  int len_local;
  int *wnaf_local;
  
  sign = -1;
  carry = 0;
  now = 1;
  word = 0;
  s.d[3]._4_4_ = w;
  memset(wnaf,0,(long)len << 2);
  _bit = a->d[0];
  s.d[0] = a->d[1];
  s.d[1] = a->d[2];
  s.d[2] = a->d[3];
  uVar1 = secp256k1_scalar_get_bits((secp256k1_scalar *)&bit,0xff,1);
  if (uVar1 != 0) {
    secp256k1_scalar_negate((secp256k1_scalar *)&bit,(secp256k1_scalar *)&bit);
    now = -1;
  }
  while (carry < len) {
    uVar1 = secp256k1_scalar_get_bits((secp256k1_scalar *)&bit,carry,1);
    if (uVar1 == word) {
      carry = carry + 1;
    }
    else {
      local_5c = s.d[3]._4_4_;
      if (len - carry < (int)s.d[3]._4_4_) {
        local_5c = len - carry;
      }
      uVar1 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)&bit,carry,local_5c);
      iVar2 = uVar1 + word;
      word = iVar2 >> ((byte)s.d[3]._4_4_ - 1 & 0x1f) & 1;
      wnaf[carry] = now * (iVar2 - (word << ((byte)s.d[3]._4_4_ & 0x1f)));
      sign = carry;
      carry = local_5c + carry;
    }
  }
  return sign + 1;
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    memset(wnaf, 0, len * sizeof(wnaf[0]));

    s = *a;
    if (secp256k1_scalar_get_bits(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    CHECK(carry == 0);
    while (bit < 256) {
        CHECK(secp256k1_scalar_get_bits(&s, bit++, 1) == 0);
    }
#endif
    return last_set_bit + 1;
}